

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::writeBlankLine(XmlWriter *this)

{
  ensureTagClosed(this);
  std::operator<<(this->m_os,"\n");
  return this;
}

Assistant:

XmlWriter& writeBlankLine() {
            ensureTagClosed();
            stream() << "\n";
            return *this;
        }